

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiArg.h
# Opt level: O0

string * __thiscall
TCLAP::MultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
shortID(string *__return_storage_ptr__,
       MultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,string *val)

{
  string local_40;
  string *local_20;
  string *val_local;
  MultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_20 = val;
  val_local = (string *)this;
  this_local = (MultiArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)__return_storage_ptr__;
  Arg::shortID(&local_40,&this->super_Arg,&this->_typeDesc);
  std::operator+(__return_storage_ptr__,&local_40," ... ");
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string MultiArg<T>::shortID(const std::string& val) const
{
	static_cast<void>(val); // Ignore input, don't warn
	return Arg::shortID(_typeDesc) + " ... ";
}